

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksLoader.cpp
# Opt level: O2

Expected<Talks> * cppti::TalksLoader::loadFrom(Expected<Talks> *__return_storage_ptr__,istream *ifs)

{
  json json;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_98;
  vector<cppti::Talk,_std::allocator<cppti::Talk>_> local_88;
  vector<cppti::Talk,_std::allocator<cppti::Talk>_> local_68 [3];
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_98,(nullptr_t)0x0);
  local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nlohmann::operator>>(ifs,&local_98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_0>
            (local_68,&local_98);
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::_M_move_assign(&local_88,local_68);
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::~vector(local_68);
  *(pointer *)
   &(__return_storage_ptr__->
    super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    ).
    super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
    .
    super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
    .field_0 = local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
               super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           ).
           super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
           .
           super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
           .field_0 + 8) =
       local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           ).
           super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
           .
           super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
           .field_0 + 0x10) =
       local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  ).
  super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  .
  super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  .
  super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  .
  super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
  .
  super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
  .m_has_val = true;
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::~vector(&local_88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_98);
  return __return_storage_ptr__;
}

Assistant:

Expected<Talks> TalksLoader::loadFrom(std::istream& ifs)
{
  auto json = nlohmann::json{};
  auto talks = Talks{};

  try
  {
    ifs >> json;
    talks = json.get<Talks>();
  }
  catch (nlohmann::json::exception const& e)
  {
    return tl::unexpected{ErrContext{ErrCode::DB_INVALID_FORMAT, e.what()}};
  }
  return talks;
}